

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

void __thiscall SQArray::~SQArray(SQArray *this)

{
  SQArray *this_local;
  
  ~SQArray(this);
  operator_delete(this);
  return;
}

Assistant:

~SQArray()
    {
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
    }